

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlElement::Attribute(TiXmlElement *this,char *name,double *d)

{
  char *__nptr;
  double dVar1;
  char *s;
  double *d_local;
  char *name_local;
  TiXmlElement *this_local;
  
  __nptr = Attribute(this,name);
  if (d != (double *)0x0) {
    if (__nptr == (char *)0x0) {
      *d = 0.0;
    }
    else {
      dVar1 = atof(__nptr);
      *d = dVar1;
    }
  }
  return __nptr;
}

Assistant:

const char* TiXmlElement::Attribute(const char* name, double* d) const {
	const char* s = Attribute(name);
	if (d) {
		if (s) {
			*d = atof(s);
		} else {
			*d = 0;
		}
	}
	return s;
}